

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

int __thiscall MeshLib::List<MeshLib::Edge>::remove(List<MeshLib::Edge> *this,char *__filename)

{
  ListNode<MeshLib::Edge> **ppLVar1;
  ListNode<MeshLib::Edge> *extraout_RAX;
  ListNode<MeshLib::Edge> *pLVar2;
  ListNode<MeshLib::Edge> *local_20;
  ListNode<MeshLib::Edge> *n;
  ListNode<MeshLib::Edge> *tn_local;
  List<MeshLib::Edge> *this_local;
  
  if ((ListNode<MeshLib::Edge> *)__filename == this->m_head) {
    ppLVar1 = ListNode<MeshLib::Edge>::next(this->m_head);
    this->m_head = *ppLVar1;
    if (__filename != (char *)0x0) {
      operator_delete(__filename);
    }
    this->m_size = this->m_size + -1;
    pLVar2 = (ListNode<MeshLib::Edge> *)this;
  }
  else {
    local_20 = this->m_head;
    while( true ) {
      ppLVar1 = ListNode<MeshLib::Edge>::next(local_20);
      pLVar2 = *ppLVar1;
      if (pLVar2 == (ListNode<MeshLib::Edge> *)__filename) break;
      ppLVar1 = ListNode<MeshLib::Edge>::next(local_20);
      local_20 = *ppLVar1;
    }
    if (local_20 != (ListNode<MeshLib::Edge> *)0x0) {
      ppLVar1 = ListNode<MeshLib::Edge>::next((ListNode<MeshLib::Edge> *)__filename);
      pLVar2 = *ppLVar1;
      ppLVar1 = ListNode<MeshLib::Edge>::next(local_20);
      *ppLVar1 = pLVar2;
      this->m_size = this->m_size + -1;
      pLVar2 = (ListNode<MeshLib::Edge> *)__filename;
      if (__filename != (char *)0x0) {
        operator_delete(__filename);
        pLVar2 = extraout_RAX;
      }
    }
  }
  return (int)pLVar2;
}

Assistant:

void List<T>::remove( ListNode<T> * tn )
{

	if( tn == m_head )
	{
		m_head = m_head->next();
		delete tn;
		m_size --;
		return;
	}

	ListNode<T> * n;
	n = m_head;

	while( n->next() != tn )
	{
		n = n->next();
	}


	if( n != NULL )
	{
		n->next() = tn->next();
		m_size --;
		delete tn;
	}
}